

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O2

Dim * __thiscall
cnn::SumColumns::dim_forward
          (Dim *__return_storage_ptr__,SumColumns *this,
          vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs)

{
  pointer pDVar1;
  long lVar2;
  uint b;
  initializer_list<unsigned_int> x;
  uint local_c;
  
  pDVar1 = (xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar2 = ((long)(xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)pDVar1) / 0x24;
  if (lVar2 == 1) {
    b = pDVar1->bd;
  }
  else {
    if (lVar2 != 2) {
      __assert_fail("xs.size() == 1 || xs.size() == 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/cnn/nodes-common.cc"
                    ,0xe4,"virtual Dim cnn::SumColumns::dim_forward(const vector<Dim> &) const");
    }
    b = pDVar1[1].bd;
    if (pDVar1[1].bd < pDVar1->bd) {
      b = pDVar1->bd;
    }
  }
  local_c = pDVar1->d[0];
  x._M_len = 1;
  x._M_array = &local_c;
  Dim::Dim(__return_storage_ptr__,x,b);
  return __return_storage_ptr__;
}

Assistant:

Dim SumColumns::dim_forward(const vector<Dim>& xs) const {
  assert(xs.size() == 1 || xs.size() == 2);
  int bd = (xs.size() == 1 ? xs[0].bd : max(xs[0].bd, xs[1].bd));
  return Dim({xs[0].rows()}, bd);
}